

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * __thiscall
testing::internal::FormatEpochTimeInMillisAsIso8601_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  size_type *psVar1;
  tm *ptVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined1 local_2b0 [8];
  tm time_struct;
  long local_268 [2];
  int local_254;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  ulong *local_190;
  long local_188;
  ulong local_180;
  long lStack_178;
  ulong *local_170;
  long local_168;
  ulong local_160;
  long lStack_158;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  long *local_130;
  undefined8 local_128;
  long local_120;
  undefined8 uStack_118;
  long *local_110;
  undefined8 local_108;
  long local_100;
  undefined8 uStack_f8;
  long *local_f0;
  undefined8 local_e8;
  long local_e0;
  undefined8 uStack_d8;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  long *local_b0;
  undefined8 local_a8;
  long local_a0;
  undefined8 uStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60;
  long lStack_58;
  ulong *local_50;
  long local_48;
  ulong local_40;
  long lStack_38;
  
  local_150 = (ulong *)((long)this / 1000);
  ptVar2 = localtime_r((time_t *)&local_150,(tm *)local_2b0);
  if (ptVar2 == (tm *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  local_254 = time_struct.tm_mday + 0x76c;
  StreamableToString<int>((string *)&time_struct.tm_zone,&local_254);
  plVar3 = (long *)std::__cxx11::string::append((char *)&time_struct.tm_zone);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_40 = *puVar5;
    lStack_38 = plVar3[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *puVar5;
    local_50 = (ulong *)*plVar3;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidthN_abi_cxx11_
            (&local_250,(String *)(ulong)(time_struct.tm_hour + 1),2,(int)puVar5);
  uVar6 = 0xf;
  if (local_50 != &local_40) {
    uVar6 = local_40;
  }
  if (uVar6 < local_250._M_string_length + local_48) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar7 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_250._M_string_length + local_48) goto LAB_00123a99;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_50);
  }
  else {
LAB_00123a99:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_250._M_dataplus._M_p);
  }
  local_b0 = &local_a0;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_a0 = *plVar3;
    uStack_98 = puVar4[3];
  }
  else {
    local_a0 = *plVar3;
    local_b0 = (long *)*puVar4;
  }
  local_a8 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_60 = *puVar5;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar5;
    local_70 = (ulong *)*plVar3;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidthN_abi_cxx11_
            (&local_230,(String *)(ulong)(uint)time_struct.tm_min,2,(int)puVar5);
  uVar6 = 0xf;
  if (local_70 != &local_60) {
    uVar6 = local_60;
  }
  if (uVar6 < local_230._M_string_length + local_68) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      uVar7 = local_230.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_230._M_string_length + local_68) goto LAB_00123bbc;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_00123bbc:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_230._M_dataplus._M_p);
  }
  local_d0 = &local_c0;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_c0 = *plVar3;
    uStack_b8 = puVar4[3];
  }
  else {
    local_c0 = *plVar3;
    local_d0 = (long *)*puVar4;
  }
  local_c8 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_160 = *puVar5;
    lStack_158 = plVar3[3];
    local_170 = &local_160;
  }
  else {
    local_160 = *puVar5;
    local_170 = (ulong *)*plVar3;
  }
  local_168 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidthN_abi_cxx11_
            (&local_210,(String *)(ulong)(uint)time_struct.tm_sec,2,(int)puVar5);
  uVar6 = 0xf;
  if (local_170 != &local_160) {
    uVar6 = local_160;
  }
  if (uVar6 < local_210._M_string_length + local_168) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      uVar7 = local_210.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_210._M_string_length + local_168) goto LAB_00123cf3;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,(ulong)local_170);
  }
  else {
LAB_00123cf3:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_210._M_dataplus._M_p);
  }
  local_f0 = &local_e0;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_e0 = *plVar3;
    uStack_d8 = puVar4[3];
  }
  else {
    local_e0 = *plVar3;
    local_f0 = (long *)*puVar4;
  }
  local_e8 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_f0);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_80 = *puVar5;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar5;
    local_90 = (ulong *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidthN_abi_cxx11_
            (&local_1f0,(String *)(ulong)(uint)local_2b0._4_4_,2,(int)puVar5);
  uVar6 = 0xf;
  if (local_90 != &local_80) {
    uVar6 = local_80;
  }
  if (uVar6 < local_1f0._M_string_length + local_88) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      uVar7 = local_1f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_1f0._M_string_length + local_88) goto LAB_00123e1f;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_90);
  }
  else {
LAB_00123e1f:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_1f0._M_dataplus._M_p);
  }
  local_110 = &local_100;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_100 = *plVar3;
    uStack_f8 = puVar4[3];
  }
  else {
    local_100 = *plVar3;
    local_110 = (long *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_110);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_180 = *puVar5;
    lStack_178 = plVar3[3];
    local_190 = &local_180;
  }
  else {
    local_180 = *puVar5;
    local_190 = (ulong *)*plVar3;
  }
  local_188 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidthN_abi_cxx11_
            (&local_1d0,(String *)(ulong)(uint)local_2b0._0_4_,2,(int)puVar5);
  uVar6 = 0xf;
  if (local_190 != &local_180) {
    uVar6 = local_180;
  }
  if (uVar6 < local_1d0._M_string_length + local_188) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      uVar7 = local_1d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_1d0._M_string_length + local_188) goto LAB_00123f5a;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_190);
  }
  else {
LAB_00123f5a:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_1d0._M_dataplus._M_p);
  }
  local_130 = &local_120;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_120 = *plVar3;
    uStack_118 = puVar4[3];
  }
  else {
    local_120 = *plVar3;
    local_130 = (long *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_130);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_140 = *puVar5;
    lStack_138 = plVar3[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar5;
    local_150 = (ulong *)*plVar3;
  }
  local_148 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidthN_abi_cxx11_
            (&local_1b0,(String *)((long)this % 1000 & 0xffffffff),3,(int)puVar5);
  uVar6 = 0xf;
  if (local_150 != &local_140) {
    uVar6 = local_140;
  }
  if (uVar6 < local_1b0._M_string_length + local_148) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      uVar7 = local_1b0.field_2._M_allocated_capacity;
    }
    if (local_1b0._M_string_length + local_148 <= (ulong)uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_150);
      goto LAB_001240bf;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_1b0._M_dataplus._M_p);
LAB_001240bf:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar7 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar7;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if ((long *)time_struct.tm_zone != local_268) {
    operator_delete(time_struct.tm_zone,local_268[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatEpochTimeInMillisAsIso8601(TimeInMillis ms) {
  struct tm time_struct;
  if (!PortableLocaltime(static_cast<time_t>(ms / 1000), &time_struct))
    return "";
  // YYYY-MM-DDThh:mm:ss.sss
  return StreamableToString(time_struct.tm_year + 1900) + "-" +
         String::FormatIntWidth2(time_struct.tm_mon + 1) + "-" +
         String::FormatIntWidth2(time_struct.tm_mday) + "T" +
         String::FormatIntWidth2(time_struct.tm_hour) + ":" +
         String::FormatIntWidth2(time_struct.tm_min) + ":" +
         String::FormatIntWidth2(time_struct.tm_sec) + "." +
         String::FormatIntWidthN(static_cast<int>(ms % 1000), 3);
}